

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScriptModule
          (BinaryWriterSpec *this,string_view filename,ScriptModule *script_module)

{
  string_view __args;
  string_view __args_00;
  string_view filename_00;
  ScriptModuleType SVar1;
  TextScriptModule *pTVar2;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar3;
  Stream *pSVar4;
  DataScriptModule<(wabt::ScriptModuleType)2> *pDVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  BinaryWriterSpec *local_88;
  char *pcStack_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  BinaryWriterSpec *local_48;
  char *pcStack_40;
  BinaryWriterSpec *local_38;
  char *local_30;
  ScriptModule *local_28;
  ScriptModule *script_module_local;
  BinaryWriterSpec *this_local;
  string_view filename_local;
  
  filename_local.data_ = (char *)filename.size_;
  this_local = (BinaryWriterSpec *)filename.data_;
  local_28 = script_module;
  script_module_local = (ScriptModule *)this;
  SVar1 = ScriptModule::type(script_module);
  if (SVar1 == Text) {
    local_38 = this_local;
    local_30 = filename_local.data_;
    pTVar2 = cast<wabt::TextScriptModule,wabt::ScriptModule>(local_28);
    filename_00.size_ = (size_type)local_30;
    filename_00.data_ = (char *)local_38;
    WriteModule(this,filename_00,&pTVar2->module);
  }
  else if (SVar1 == Binary) {
    local_48 = this_local;
    pcStack_40 = filename_local.data_;
    __args_00.size_ = (size_type)filename_local.data_;
    __args_00.data_ = (char *)this_local;
    pSVar4 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                       (&this->module_stream_factory_,__args_00);
    pDVar3 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_60,&pDVar3->data);
    Stream::WriteData<unsigned_char>(pSVar4,&local_60,"",No);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
  }
  else if (SVar1 == Quoted) {
    local_88 = this_local;
    pcStack_80 = filename_local.data_;
    __args.size_ = (size_type)filename_local.data_;
    __args.data_ = (char *)this_local;
    pSVar4 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                       (&this->module_stream_factory_,__args);
    pDVar5 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>(local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a0,&pDVar5->data);
    Stream::WriteData<unsigned_char>(pSVar4,&local_a0,"",No);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteScriptModule(string_view filename,
                                         const ScriptModule& script_module) {
  switch (script_module.type()) {
    case ScriptModuleType::Text:
      WriteModule(filename, cast<TextScriptModule>(&script_module)->module);
      break;

    case ScriptModuleType::Binary:
      module_stream_factory_(filename)->WriteData(
          cast<BinaryScriptModule>(&script_module)->data, "");
      break;

    case ScriptModuleType::Quoted:
      module_stream_factory_(filename)->WriteData(
          cast<QuotedScriptModule>(&script_module)->data, "");
      break;
  }
}